

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart_p.h
# Opt level: O2

void __thiscall QHttpPartPrivate::~QHttpPartPrivate(QHttpPartPrivate *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->header).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->body).d);
  QNetworkHeadersPrivate::~QNetworkHeadersPrivate(&this->super_QNetworkHeadersPrivate);
  return;
}

Assistant:

~QHttpPartPrivate()
    {
    }